

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta)

{
  int *piVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  rc_size rVar5;
  long lVar6;
  undefined8 extraout_RAX;
  row_iterator prVar7;
  ulong uVar8;
  rc_data *prVar9;
  uint r_size;
  rc_data *__first;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_80;
  int local_7c;
  undefined4 local_78;
  float local_74;
  float local_70;
  float local_6c;
  rc_data *local_68;
  int *local_60;
  bit_array *local_58;
  int *local_50;
  solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
  *local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  local_74 = theta;
  local_70 = delta;
  local_6c = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_6c,&local_70,&local_74);
  if (first._M_current == last._M_current) {
    uVar3 = 0;
  }
  else {
    local_48 = this + 0x10;
    uVar3 = 0;
    local_58 = x;
    local_50 = last._M_current;
    do {
      local_80 = *first._M_current;
      if (*(int *)(this + 0x80) <= local_80) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_78 = uVar3;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_48);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar6 = *(long *)(this + 0x50);
        prVar7 = local_38;
        do {
          piVar1 = &prVar7->value;
          prVar7 = prVar7 + 1;
          *(float *)(lVar6 + (long)*piVar1 * 4) = local_74 * *(float *)(lVar6 + (long)*piVar1 * 4);
        } while (prVar7 != (row_iterator)local_40._M_head_impl);
      }
      rVar5 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_38,(row_iterator)local_40._M_head_impl,x);
      r_size = rVar5.r_size;
      lVar6 = (long)(int)r_size;
      if (1 < lVar6) {
        __first = *(rc_data **)(this + 0x60);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar9 = __first + lVar6;
        local_60 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar9,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
        local_68 = prVar9;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar9);
        lVar6 = lVar6 * 0xc + -0xc;
        prVar9 = __first;
        do {
          prVar9 = prVar9 + 1;
          if ((__first->value != prVar9->value) || (NAN(__first->value) || NAN(prVar9->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar9,__g);
            __first = prVar9;
          }
          lVar6 = lVar6 + -0xc;
        } while (lVar6 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_68,__g);
        first._M_current = local_60;
      }
      piVar1 = (int *)(*(long *)(this + 0x68) + (long)local_80 * 8);
      uVar4 = rVar5.c_size + *piVar1;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_7c = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_80,piVar1);
      if (0 < (int)r_size) {
        uVar8 = (ulong)(r_size & 0x7fffffff);
        lVar6 = 8;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (float *)(*(long *)(this + 0x60) + -8 + lVar6),
                     (int *)(*(long *)(this + 0x60) + lVar6));
          lVar6 = lVar6 + 0xc;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_7c);
      x = local_58;
      bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_58,local_38,local_80,local_7c,r_size,local_6c,local_70);
      first._M_current = first._M_current + 1;
      uVar3 = CONCAT31((int3)((uint)local_78 >> 8),(byte)local_78 | bVar2);
    } while (first._M_current != local_50);
  }
  return (bool)((byte)uVar3 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }